

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O1

SysCallInt64Result cppnet::OsHandle::TcpSocket(bool ipv4)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  SysCallInt64Result SVar4;
  
  iVar3 = 0;
  iVar1 = socket((uint)!ipv4 * 8 + 2,1,0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar3 = *piVar2;
  }
  SVar4._return_value = (long)iVar1;
  SVar4._errno = iVar3;
  SVar4._12_4_ = 0;
  return SVar4;
}

Assistant:

SysCallInt64Result OsHandle::TcpSocket(bool ipv4) {
    int domain = PF_INET6;
    if (ipv4) {
        domain = PF_INET;
    }

    int64_t sock = socket(domain, SOCK_STREAM, 0);
    if (sock < 0) {
        return {sock, errno};
    }
    return {sock, 0};
}